

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::Chapter::WriteAtom(Chapter *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64 uVar4;
  uint64 uVar5;
  uint64 uVar6;
  uint64_t uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t stop;
  Display *d_1;
  int idx_1;
  int64_t start;
  uint64_t atom_size;
  Display *d;
  uint64 uStack_28;
  int idx;
  uint64_t payload_size;
  IMkvWriter *writer_local;
  Chapter *this_local;
  
  uVar4 = EbmlElementSize(0x5654,this->id_);
  uVar5 = EbmlElementSize(0x73c4,this->uid_);
  uVar6 = EbmlElementSize(0x91,this->start_timecode_);
  uStack_28 = EbmlElementSize(0x92,this->end_timecode_);
  uStack_28 = uVar4 + uVar5 + uVar6 + uStack_28;
  for (d._4_4_ = 0; d._4_4_ < this->displays_count_; d._4_4_ = d._4_4_ + 1) {
    uVar7 = Display::WriteDisplay(this->displays_ + d._4_4_,(IMkvWriter *)0x0);
    uStack_28 = uVar7 + uStack_28;
  }
  uVar4 = EbmlMasterElementSize(0xb6,uStack_28);
  this_local = (Chapter *)(uVar4 + uStack_28);
  if (writer != (IMkvWriter *)0x0) {
    iVar2 = (*writer->_vptr_IMkvWriter[1])();
    bVar1 = WriteEbmlMasterElement(writer,0xb6,uStack_28);
    if (bVar1) {
      bVar1 = WriteEbmlElement(writer,0x5654,this->id_);
      if (bVar1) {
        bVar1 = WriteEbmlElement(writer,0x73c4,this->uid_);
        if (bVar1) {
          bVar1 = WriteEbmlElement(writer,0x91,this->start_timecode_);
          if (bVar1) {
            bVar1 = WriteEbmlElement(writer,0x92,this->end_timecode_);
            if (bVar1) {
              for (d_1._4_4_ = 0; d_1._4_4_ < this->displays_count_; d_1._4_4_ = d_1._4_4_ + 1) {
                uVar7 = Display::WriteDisplay(this->displays_ + d_1._4_4_,writer);
                if (uVar7 == 0) {
                  return 0;
                }
              }
              iVar3 = (*writer->_vptr_IMkvWriter[1])();
              if ((CONCAT44(extraout_var,iVar2) <= CONCAT44(extraout_var_00,iVar3)) &&
                 ((Chapter *)(CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2)) !=
                  this_local)) {
                this_local = (Chapter *)0x0;
              }
            }
            else {
              this_local = (Chapter *)0x0;
            }
          }
          else {
            this_local = (Chapter *)0x0;
          }
        }
        else {
          this_local = (Chapter *)0x0;
        }
      }
      else {
        this_local = (Chapter *)0x0;
      }
    }
    else {
      this_local = (Chapter *)0x0;
    }
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t Chapter::WriteAtom(IMkvWriter* writer) const {
  uint64_t payload_size =
      EbmlElementSize(libwebm::kMkvChapterStringUID, id_) +
      EbmlElementSize(libwebm::kMkvChapterUID, static_cast<uint64>(uid_)) +
      EbmlElementSize(libwebm::kMkvChapterTimeStart,
                      static_cast<uint64>(start_timecode_)) +
      EbmlElementSize(libwebm::kMkvChapterTimeEnd,
                      static_cast<uint64>(end_timecode_));

  for (int idx = 0; idx < displays_count_; ++idx) {
    const Display& d = displays_[idx];
    payload_size += d.WriteDisplay(NULL);
  }

  const uint64_t atom_size =
      EbmlMasterElementSize(libwebm::kMkvChapterAtom, payload_size) +
      payload_size;

  if (writer == NULL)
    return atom_size;

  const int64_t start = writer->Position();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvChapterAtom, payload_size))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapterStringUID, id_))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapterUID,
                        static_cast<uint64>(uid_)))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapterTimeStart,
                        static_cast<uint64>(start_timecode_)))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapterTimeEnd,
                        static_cast<uint64>(end_timecode_)))
    return 0;

  for (int idx = 0; idx < displays_count_; ++idx) {
    const Display& d = displays_[idx];

    if (!d.WriteDisplay(writer))
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != atom_size)
    return 0;

  return atom_size;
}